

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallHeapBlockAllocator.cpp
# Opt level: O3

void __thiscall
Memory::
SmallHeapBlockAllocator<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>::Clear
          (SmallHeapBlockAllocator<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>
           *this)

{
  size_t *psVar1;
  SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *this_00;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  undefined4 *puVar6;
  SmallHeapBlockAllocator<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>>
  *this_01;
  Recycler *pRVar7;
  SmallHeapBlockT<MediumAllocationBlockAttributes> *this_02;
  FreeObject *pFVar8;
  
  this_00 = this->heapBlock;
  if (this_00 == (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    pFVar8 = this->freeObjectList;
    if (pFVar8 != (FreeObject *)0x0) {
      this_01 = (SmallHeapBlockAllocator<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>>
                 *)__tls_get_addr(&PTR_01548f08);
      do {
        pRVar7 = HeapBucket::GetRecycler(this->bucket);
        if ((pFVar8 < (FreeObject *)0x10000) || (((ulong)pFVar8 & 0xf) != 0)) {
LAB_0073ab15:
          SmallHeapBlockAllocator<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>>
          ::Clear(this_01);
          goto LAB_0073ab1d;
        }
        this_02 = (SmallHeapBlockT<MediumAllocationBlockAttributes> *)
                  HeapBlockMap64::GetHeapBlock(&pRVar7->heapBlockMap,pFVar8);
        if (this_02 == (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) goto LAB_0073ab15;
        if ((this_02->super_HeapBlock).heapBlockType == LargeBlockType) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *(undefined4 *)this_01 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.cpp"
                             ,0x84,"(!heapBlockVerify->IsLargeHeapBlock())",
                             "!heapBlockVerify->IsLargeHeapBlock()");
          if (!bVar3) goto LAB_0073ab1d;
          *(undefined4 *)this_01 = 0;
        }
        SmallHeapBlockT<MediumAllocationBlockAttributes>::ClearExplicitFreeBitForObject
                  (this_02,pFVar8);
        pFVar8 = FreeObject::GetNext(pFVar8);
      } while (pFVar8 != (FreeObject *)0x0);
      this->freeObjectList = (FreeObject *)0x0;
    }
    return;
  }
  if ((this_00->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>).
      super_SmallHeapBlockT<MediumAllocationBlockAttributes>.isInAllocator == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.cpp"
                       ,0x3c,"(heapBlock->isInAllocator)","heapBlock->isInAllocator");
    if (!bVar3) goto LAB_0073ab1d;
    *puVar6 = 0;
  }
  (this_00->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>).
  super_SmallHeapBlockT<MediumAllocationBlockAttributes>.isInAllocator = false;
  if (this->endAddress == (char *)0x0) {
    pFVar8 = this->freeObjectList;
    (this_00->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>).
    super_SmallHeapBlockT<MediumAllocationBlockAttributes>.freeObjectList = pFVar8;
    this->freeObjectList = (FreeObject *)0x0;
    if (pFVar8 != (FreeObject *)0x0) {
      SmallHeapBlockT<MediumAllocationBlockAttributes>::SetIsClearedFromAllocator
                ((SmallHeapBlockT<MediumAllocationBlockAttributes> *)this_00,true);
      goto LAB_0073aaf5;
    }
  }
  else {
    TrackNativeAllocatedObjects(this);
    this->lastNonNativeBumpAllocatedBlock = (char *)0x0;
    Recycler::TrackUnallocated
              (this->bucket->heapInfo->recycler,(char *)this->freeObjectList,this->endAddress,
               (ulong)this->bucket->sizeCat);
    RecyclerMemoryTracking::ReportUnallocated
              (((this->heapBlock->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>).
                super_SmallHeapBlockT<MediumAllocationBlockAttributes>.heapBucket)->heapInfo->
               recycler,this->freeObjectList,this->endAddress,
               (ulong)((this_00->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>).
                       super_SmallHeapBlockT<MediumAllocationBlockAttributes>.heapBucket)->sizeCat);
    if ((this_00->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>).
        super_SmallHeapBlockT<MediumAllocationBlockAttributes>.freeObjectList != (FreeObject *)0x0)
    {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.cpp"
                         ,0x54,"(heapBlock->freeObjectList == nullptr)",
                         "heapBlock->freeObjectList == nullptr");
      if (!bVar3) goto LAB_0073ab1d;
      *puVar6 = 0;
    }
    this->endAddress = (char *)0x0;
    this->freeObjectList = (FreeObject *)0x0;
  }
  uVar4 = SmallHeapBlockT<MediumAllocationBlockAttributes>::GetAndClearLastFreeCount
                    ((SmallHeapBlockT<MediumAllocationBlockAttributes> *)this_00);
  uVar5 = (this_00->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>).
          super_SmallHeapBlockT<MediumAllocationBlockAttributes>.objectSize * uVar4;
  psVar1 = &(((this_00->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>).
              super_SmallHeapBlockT<MediumAllocationBlockAttributes>.heapBucket)->heapInfo->recycler
            ->autoHeap).uncollectedAllocBytes;
  *psVar1 = *psVar1 + (ulong)uVar5;
  if ((this_00->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>).
      super_SmallHeapBlockT<MediumAllocationBlockAttributes>.lastUncollectedAllocBytes != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.cpp"
                       ,0x6f,"(heapBlock->lastUncollectedAllocBytes == 0)",
                       "heapBlock->lastUncollectedAllocBytes == 0");
    if (!bVar3) {
LAB_0073ab1d:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
    uVar5 = uVar4 * (this_00->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>).
                    super_SmallHeapBlockT<MediumAllocationBlockAttributes>.objectSize;
  }
  (this_00->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>).
  super_SmallHeapBlockT<MediumAllocationBlockAttributes>.lastUncollectedAllocBytes = uVar5;
LAB_0073aaf5:
  this->heapBlock = (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
  SmallHeapBlockT<MediumAllocationBlockAttributes>::CheckDebugFreeBitVector
            ((SmallHeapBlockT<MediumAllocationBlockAttributes> *)this_00,false);
  return;
}

Assistant:

void
SmallHeapBlockAllocator<TBlockType>::Clear()
{
    TBlockType * heapBlock = this->heapBlock;
    if (heapBlock != nullptr)
    {
        Assert(heapBlock->isInAllocator);
        heapBlock->isInAllocator = false;
        FreeObject * remainingFreeObjectList = nullptr;
        if (this->endAddress != nullptr)
        {
#ifdef RECYCLER_TRACK_NATIVE_ALLOCATED_OBJECTS
            TrackNativeAllocatedObjects();
            lastNonNativeBumpAllocatedBlock = nullptr;
#endif
#ifdef PROFILE_RECYCLER_ALLOC
            // Need to tell the tracker
            this->bucket->heapInfo->recycler->TrackUnallocated((char *)this->freeObjectList, this->endAddress, this->bucket->sizeCat);
#endif
            RecyclerMemoryTracking::ReportUnallocated(this->heapBlock->heapBucket->heapInfo->recycler, (char *)this->freeObjectList, this->endAddress, heapBlock->heapBucket->sizeCat);
#ifdef RECYCLER_PERF_COUNTERS
            size_t unallocatedObjects = heapBlock->objectCount - ((char *)this->freeObjectList - heapBlock->address) / heapBlock->objectSize;
            size_t unallocatedObjectBytes = unallocatedObjects * heapBlock->GetObjectSize();
            RECYCLER_PERF_COUNTER_ADD(LiveObject, unallocatedObjects);
            RECYCLER_PERF_COUNTER_ADD(LiveObjectSize, unallocatedObjectBytes);
            RECYCLER_PERF_COUNTER_SUB(FreeObjectSize, unallocatedObjectBytes);
            RECYCLER_PERF_COUNTER_ADD(SmallHeapBlockLiveObject, unallocatedObjects);
            RECYCLER_PERF_COUNTER_ADD(SmallHeapBlockLiveObjectSize, unallocatedObjectBytes);
            RECYCLER_PERF_COUNTER_SUB(SmallHeapBlockFreeObjectSize, unallocatedObjectBytes);
#endif
            Assert(heapBlock->freeObjectList == nullptr);
            this->endAddress = nullptr;
        }
        else
        {
            remainingFreeObjectList = this->freeObjectList;
            heapBlock->freeObjectList = remainingFreeObjectList;
        }
        this->freeObjectList = nullptr;

        // this->freeObjectList and this->lastFreeCount are accessed in SmallHeapBlock::ResetMarks
        // the order of access there is first we see if lastFreeCount = 0, and if it is, we assert
        // that freeObjectList = null. Because of ARM's memory model, we need to insert barriers
        // so that the two variables can be accessed correctly across threads. Here, after we write
        // to this->freeObjectList, we insert a write barrier so that if this->lastFreeCount is 0,
        // this->freeObjectList must have been set to null. On the other end, we stick a read barrier
        // We use the MemoryBarrier macro because of ARMs lack of a separate read barrier
#if defined(_M_ARM32_OR_ARM64)
#if DBG
        MemoryBarrier();
#endif
#endif

        if (remainingFreeObjectList == nullptr)
        {
            uint lastFreeCount = heapBlock->GetAndClearLastFreeCount();
            heapBlock->heapBucket->heapInfo->recycler->autoHeap.uncollectedAllocBytes += lastFreeCount * heapBlock->GetObjectSize();
            Assert(heapBlock->lastUncollectedAllocBytes == 0);
            DebugOnly(heapBlock->lastUncollectedAllocBytes = lastFreeCount * heapBlock->GetObjectSize());
        }
        else
        {
            DebugOnly(heapBlock->SetIsClearedFromAllocator(true));
        }
        this->heapBlock = nullptr;

        RECYCLER_SLOW_CHECK(heapBlock->CheckDebugFreeBitVector(false));
    }
    else if (this->freeObjectList != nullptr)
    {
        // Explicit Free Object List
#ifdef RECYCLER_MEMORY_VERIFY
        FreeObject* freeObject = this->freeObjectList;

        while (freeObject)
        {
            HeapBlock* heapBlockVerify = this->bucket->GetRecycler()->FindHeapBlock((void*) freeObject);
            Assert(heapBlockVerify != nullptr);
            Assert(!heapBlockVerify->IsLargeHeapBlock());
            TBlockType* smallBlock = (TBlockType*)heapBlockVerify;

            smallBlock->ClearExplicitFreeBitForObject((void*) freeObject);
            freeObject = freeObject->GetNext();
        }
#endif
        this->freeObjectList = nullptr;
    }
#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP 
    DebugOnly(this->isAllocatingFromNewBlock = false);
#endif
}